

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset.c
# Opt level: O3

int parse_pmc_id(uint32_t pmc_id,chipset_info *info)

{
  gpu_index gVar1;
  int iVar2;
  uint uVar3;
  _Bool *p_Var4;
  uint uVar5;
  long lVar6;
  
  *(undefined8 *)&info->gpu = 0;
  info->gpu_desc = (gpu *)0x0;
  info->pmc_id = 0;
  info->chipset = 0;
  info->card_type = 0;
  info->endian = 0;
  info->gpu = GPU_UNKNOWN;
  if ((int)pmc_id < 0) {
    if ((pmc_id & 0xf80) != 0x80) {
      info->endian = 1;
      pmc_id = pmc_id >> 0x18 | (pmc_id & 0xff0000) >> 8 | (pmc_id & 0xff00) << 8 | pmc_id << 0x18;
    }
    info->pmc_id = pmc_id;
    if ((int)pmc_id < 0 && (pmc_id & 0xf00) != 0) {
      return -1;
    }
  }
  else {
    info->pmc_id = pmc_id;
  }
  if ((char)pmc_id < '\0') {
    uVar3 = pmc_id >> 0x14 & 0x1ff;
    info->chipset = uVar3;
    uVar5 = pmc_id >> 0x14 & 0x1f0;
    info->card_type = uVar5;
    iVar2 = 0x40;
    if (((uVar5 == 0x60) || (iVar2 = 0x50, uVar5 - 0x80 < 0x21)) ||
       (iVar2 = 0xc0, uVar5 - 0xc0 < 0x41)) {
      info->card_type = iVar2;
    }
    p_Var4 = &gpu_list[0].id_valid;
    gVar1 = GPU_UNKNOWN;
    lVar6 = 0;
    do {
      if ((*p_Var4 == true) && (*(uint32_t *)(p_Var4 + -4) == uVar3)) {
        gVar1 = (gpu_index)lVar6;
        info->gpu = gVar1;
      }
      lVar6 = lVar6 + 1;
      p_Var4 = p_Var4 + 0x40;
    } while (lVar6 != 0x5c);
    if (gVar1 == GPU_UNKNOWN) {
      return -1;
    }
  }
  else if ((pmc_id & 0xf000) == 0) {
    uVar3 = pmc_id >> 0x10 & 0xf;
    info->chipset = uVar3;
    info->card_type = uVar3;
    if (uVar3 == 3) {
      if ((pmc_id & 0x60) == 0) {
        info->gpu = GPU_NV3;
        gVar1 = GPU_NV3;
      }
      else {
        info->gpu = GPU_NV3T;
        gVar1 = GPU_NV3T;
      }
    }
    else {
      if (uVar3 != 1) {
        return -1;
      }
      info->gpu = GPU_NV1;
      gVar1 = GPU_NV1;
    }
  }
  else {
    uVar3 = (uint)((pmc_id & 0xf00000) == 0);
    gVar1 = GPU_NV5 - uVar3;
    info->chipset = uVar3 ^ 5;
    info->gpu = gVar1;
    info->card_type = 4;
  }
  info->gpu_desc = gpu_list + gVar1;
  return 0;
}

Assistant:

int parse_pmc_id(uint32_t pmc_id, struct chipset_info *info) {
	/* First, detect PMC_ID format and endianness */
	memset(info, 0, sizeof *info);
	info->endian = 0;
	info->gpu = GPU_UNKNOWN;
	info->gpu_desc = 0;
	if (pmc_id_flipped(pmc_id)) {
		/* bit 31 set - set endian flag and byteswap */
		info->endian = 1;
		pmc_id = (pmc_id & 0x0000ffff) << 16 | (pmc_id & 0xffff0000) >> 16;
		pmc_id = (pmc_id & 0x00ff00ff) << 8 | (pmc_id & 0xff00ff00) >> 8;
	}
	info->pmc_id = pmc_id;
	if (pmc_id & 0x80000000 && pmc_id & 0x00000F00) {
		/* bit 31 still set - ie. old bit 7 was set, and bits 8-11 are
		 * still nonzero - BAR0 is broken */
		return -1;
	}
	if (pmc_id & 0x80) {
		/* NV10+ */
		info->chipset = pmc_id >> 20 & 0x1ff;
		info->card_type = info->chipset & 0x1f0;
		if (info->card_type == 0x60) {
			info->card_type = 0x40;
		} else if (info->card_type >= 0x80 && info->card_type <= 0xa0) {
			info->card_type = 0x50;
		} else if (info->card_type >= 0xc0 && info->card_type <= 0x100) {
			info->card_type = 0xc0;
		}
		for (int i = 0; i < NUM_GPU; i++) {
			if (gpu_list[i].id_valid && gpu_list[i].id == info->chipset) {
				info->gpu = i;
			}
		}
	} else {
		/* pre-NV10 */
		if (pmc_id & 0xf000) {
			if (pmc_id & 0xf00000) {
				info->chipset = 5;
				info->gpu = GPU_NV5;
			} else {
				info->chipset = 4;
				info->gpu = GPU_NV4;
			}
			info->card_type = 4;
		} else {
			info->chipset = pmc_id >> 16 & 0xf;
			info->card_type = info->chipset;
			if (info->chipset == 1) {
				info->gpu = GPU_NV1;
			} else if (info->chipset == 3) {
				if ((pmc_id & 0xff) >= 0x20) {
					info->gpu = GPU_NV3T;
				} else {
					info->gpu = GPU_NV3;
				}
			}
		}
	}
	if (info->gpu != GPU_UNKNOWN) {
		info->gpu_desc = &gpu_list[info->gpu];
		return 0;
	} else {
		return -1;
	}
}